

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O2

xml_node<char> * __thiscall
rapidxml::memory_pool<char>::allocate_node
          (memory_pool<char> *this,node_type type,char *name,char *value,size_t name_size,
          size_t value_size)

{
  xml_node<char> *this_00;
  
  this_00 = (xml_node<char> *)allocate_aligned(this,0x60);
  (this_00->super_xml_base<char>).m_parent = (xml_node<char> *)0x0;
  (this_00->super_xml_base<char>).m_name = (char *)0x0;
  (this_00->super_xml_base<char>).m_value = (char *)0x0;
  this_00->m_type = type;
  this_00->m_first_node = (xml_node<char> *)0x0;
  this_00->m_first_attribute = (xml_attribute<char> *)0x0;
  if (name != (char *)0x0) {
    if (name_size == 0) {
      xml_base<char>::name((xml_base<char> *)this_00,name);
    }
    else {
      (this_00->super_xml_base<char>).m_name = name;
      (this_00->super_xml_base<char>).m_name_size = name_size;
    }
  }
  if (value != (char *)0x0) {
    if (value_size == 0) {
      xml_base<char>::value((xml_base<char> *)this_00,value);
    }
    else {
      (this_00->super_xml_base<char>).m_value = value;
      (this_00->super_xml_base<char>).m_value_size = value_size;
    }
  }
  return this_00;
}

Assistant:

xml_node<Ch> *allocate_node(node_type type, 
                                    const Ch *name = 0, const Ch *value = 0, 
                                    std::size_t name_size = 0, std::size_t value_size = 0)
        {
            void *memory = allocate_aligned(sizeof(xml_node<Ch>));
            xml_node<Ch> *node = new(memory) xml_node<Ch>(type);
            if (name)
            {
                if (name_size > 0)
                    node->name(name, name_size);
                else
                    node->name(name);
            }
            if (value)
            {
                if (value_size > 0)
                    node->value(value, value_size);
                else
                    node->value(value);
            }
            return node;
        }